

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [54];
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Drawable,_Square,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  local_19a;
  App<Square> local_199;
  stringstream local_198 [7];
  App<Square> example;
  stringstream str;
  ostream local_188 [380];
  int local_c;
  
  local_c = 0;
  std::__cxx11::stringstream::stringstream(local_198);
  anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&config);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Drawable,_Square,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<App,_App<Square>,_0>(&local_19a);
  App<Square>::draw(&local_199,local_188);
  std::__cxx11::stringstream::str();
  bVar1 = std::operator==("Square",local_1d0);
  if (!bVar1) {
    __assert_fail("\"Square\" == str.str()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/polymorphism/templates.cpp"
                  ,0x23,"int main()");
  }
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return local_c;
}

Assistant:

int main() {
  std::stringstream str{};
  auto example = config().create<App>();
  example.draw(str);
  assert("Square" == str.str());
}